

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.h
# Opt level: O3

void __thiscall
basisu::basis_compressor_params::~basis_compressor_params(basis_compressor_params *this)

{
  uint uVar1;
  void *pvVar2;
  pointer pcVar3;
  long lVar4;
  ulong uVar5;
  vector<basisu::image> *pvVar6;
  key_value *__ptr;
  vector<basisu::image> *__ptr_00;
  image *piVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  
  __ptr = (this->m_ktx2_key_values).m_p;
  if (__ptr != (key_value *)0x0) {
    uVar5 = (ulong)(this->m_ktx2_key_values).m_size;
    if (uVar5 != 0) {
      lVar4 = 0;
      do {
        pvVar2 = *(void **)((long)&(__ptr->m_value).m_p + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        pvVar2 = *(void **)((long)&(__ptr->m_key).m_p + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar4 = lVar4 + 0x20;
      } while (uVar5 << 5 != lVar4);
      __ptr = (this->m_ktx2_key_values).m_p;
    }
    free(__ptr);
  }
  pcVar3 = (this->m_mip_filter)._M_dataplus._M_p;
  paVar8 = &(this->m_mip_filter).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar8) {
    operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_out_filename)._M_dataplus._M_p;
  paVar8 = &(this->m_out_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar8) {
    operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
  }
  __ptr_00 = (this->m_source_mipmap_images).m_p;
  if (__ptr_00 != (vector<basisu::image> *)0x0) {
    uVar5 = (ulong)(this->m_source_mipmap_images).m_size;
    if (uVar5 != 0) {
      pvVar6 = __ptr_00 + uVar5;
      do {
        piVar7 = __ptr_00->m_p;
        if (piVar7 != (image *)0x0) {
          uVar1 = __ptr_00->m_size;
          if ((ulong)uVar1 != 0) {
            lVar4 = 0;
            do {
              pvVar2 = *(void **)((long)&(piVar7->m_pixels).m_p + lVar4);
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
              lVar4 = lVar4 + 0x20;
            } while ((ulong)uVar1 << 5 != lVar4);
            piVar7 = __ptr_00->m_p;
          }
          free(piVar7);
        }
        __ptr_00 = __ptr_00 + 1;
      } while (__ptr_00 != pvVar6);
      __ptr_00 = (this->m_source_mipmap_images).m_p;
    }
    free(__ptr_00);
  }
  piVar7 = (this->m_source_images).m_p;
  if (piVar7 != (image *)0x0) {
    uVar5 = (ulong)(this->m_source_images).m_size;
    if (uVar5 != 0) {
      lVar4 = 0;
      do {
        pvVar2 = *(void **)((long)&(piVar7->m_pixels).m_p + lVar4);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar4 = lVar4 + 0x20;
      } while (uVar5 << 5 != lVar4);
      piVar7 = (this->m_source_images).m_p;
    }
    free(piVar7);
  }
  pbVar9 = (this->m_source_alpha_filenames).m_p;
  if (pbVar9 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    uVar5 = (ulong)(this->m_source_alpha_filenames).m_size;
    if (uVar5 != 0) {
      lVar4 = uVar5 << 5;
      paVar8 = &pbVar9->field_2;
      do {
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar8->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                          paVar8->_M_allocated_capacity + 1);
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar8->_M_allocated_capacity + 4);
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
      pbVar9 = (this->m_source_alpha_filenames).m_p;
    }
    free(pbVar9);
  }
  pbVar9 = (this->m_source_filenames).m_p;
  if (pbVar9 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    uVar5 = (ulong)(this->m_source_filenames).m_size;
    if (uVar5 != 0) {
      lVar4 = uVar5 << 5;
      paVar8 = &pbVar9->field_2;
      do {
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar8->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                          paVar8->_M_allocated_capacity + 1);
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar8->_M_allocated_capacity + 4);
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
      pbVar9 = (this->m_source_filenames).m_p;
    }
    free(pbVar9);
    return;
  }
  return;
}

Assistant:

basis_compressor_params() :
			m_compression_level((int)BASISU_DEFAULT_COMPRESSION_LEVEL, 0, (int)BASISU_MAX_COMPRESSION_LEVEL),
			m_selector_rdo_thresh(BASISU_DEFAULT_SELECTOR_RDO_THRESH, 0.0f, 1e+10f),
			m_endpoint_rdo_thresh(BASISU_DEFAULT_ENDPOINT_RDO_THRESH, 0.0f, 1e+10f),
			m_mip_scale(1.0f, .000125f, 4.0f),
			m_mip_smallest_dimension(1, 1, 16384),
			m_max_endpoint_clusters(512),
			m_max_selector_clusters(512),
			m_quality_level(-1),
			m_pack_uastc_flags(cPackUASTCLevelDefault),
			m_rdo_uastc_quality_scalar(1.0f, 0.001f, 50.0f),
			m_rdo_uastc_dict_size(BASISU_RDO_UASTC_DICT_SIZE_DEFAULT, BASISU_RDO_UASTC_DICT_SIZE_MIN, BASISU_RDO_UASTC_DICT_SIZE_MAX),
			m_rdo_uastc_max_smooth_block_error_scale(UASTC_RDO_DEFAULT_SMOOTH_BLOCK_MAX_ERROR_SCALE, 1.0f, 300.0f),
			m_rdo_uastc_smooth_block_max_std_dev(UASTC_RDO_DEFAULT_MAX_SMOOTH_BLOCK_STD_DEV, .01f, 65536.0f),
			m_rdo_uastc_max_allowed_rms_increase_ratio(UASTC_RDO_DEFAULT_MAX_ALLOWED_RMS_INCREASE_RATIO, .01f, 100.0f),
			m_rdo_uastc_skip_block_rms_thresh(UASTC_RDO_DEFAULT_SKIP_BLOCK_RMS_THRESH, .01f, 100.0f),
			m_resample_width(0, 1, 16384),
			m_resample_height(0, 1, 16384),
			m_resample_factor(0.0f, .00125f, 100.0f),
			m_ktx2_uastc_supercompression(basist::KTX2_SS_NONE),
			m_ktx2_zstd_supercompression_level(6, INT_MIN, INT_MAX),
			m_pJob_pool(nullptr)
		{
			clear();
		}